

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.cpp
# Opt level: O2

int main(void)

{
  uint __line;
  IMathService *instance;
  char *__assertion;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  undefined1 local_e8 [16];
  shared_ptr<IMathService> mathService;
  shared_ptr<MathService> test;
  undefined1 local_b8 [16];
  ServiceLocator locator;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  ServiceLocator::ServiceLocator(&locator);
  instance = (IMathService *)operator_new(0x10);
  instance->_vptr_IMathService = (_func_int **)0x0;
  instance[1]._vptr_IMathService = (_func_int **)0x0;
  instance->_vptr_IMathService = (_func_int **)&PTR__IMathService_00106c28;
  ServiceLocator::registerInstance<IMathService>(&locator,instance);
  ServiceLocator::resolve<IMathService>((ServiceLocator *)&mathService);
  if (mathService.super___shared_ptr<IMathService,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    __assertion = "mathService";
    __line = 0x24;
  }
  else {
    test.super___shared_ptr<MathService,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0x41200000;
    local_e8._0_4_ = 0x41a00000;
    (*(mathService.super___shared_ptr<IMathService,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_IMathService[2])();
    if ((extraout_XMM0_Da != 30.0) || (NAN(extraout_XMM0_Da))) {
      __assertion = "mathService->add(10, 20) == 30";
      __line = 0x25;
    }
    else {
      test.super___shared_ptr<MathService,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0x41f00000;
      local_e8._0_4_ = 0x41200000;
      (*(mathService.super___shared_ptr<IMathService,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_IMathService[3])();
      if ((extraout_XMM0_Da_00 != 20.0) || (NAN(extraout_XMM0_Da_00))) {
        __assertion = "mathService->subtract(30, 10) == 20";
        __line = 0x26;
      }
      else {
        test.super___shared_ptr<MathService,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0x40000000;
        local_e8._0_4_ = 0x40200000;
        (*(mathService.super___shared_ptr<IMathService,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          _vptr_IMathService[4])();
        if ((extraout_XMM0_Da_01 != 5.0) || (NAN(extraout_XMM0_Da_01))) {
          __assertion = "mathService->multiply(2, 2.5) == 5";
          __line = 0x27;
        }
        else {
          test.super___shared_ptr<MathService,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0x41f00000
          ;
          local_e8._0_4_ = 0x41200000;
          (*(mathService.super___shared_ptr<IMathService,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_IMathService[5])();
          if ((extraout_XMM0_Da_02 != 3.0) || (NAN(extraout_XMM0_Da_02))) {
            __assertion = "mathService->divide(30, 10) == 3";
            __line = 0x28;
          }
          else {
            std::static_pointer_cast<MathService,IMathService>((shared_ptr<IMathService> *)&test);
            if (*(int *)(CONCAT44(test.super___shared_ptr<MathService,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr._4_4_,
                                  test.super___shared_ptr<MathService,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr._0_4_) + 8) == 0) {
              *(undefined4 *)
               (CONCAT44(test.super___shared_ptr<MathService,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                         _4_4_,test.super___shared_ptr<MathService,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr._0_4_) + 8) = 1;
              ServiceLocator::resolve<IMathService>((ServiceLocator *)local_b8);
              std::static_pointer_cast<MathService,IMathService>
                        ((shared_ptr<IMathService> *)local_e8);
              std::__shared_ptr<MathService,_(__gnu_cxx::_Lock_policy)2>::operator=
                        (&test.super___shared_ptr<MathService,_(__gnu_cxx::_Lock_policy)2>,
                         (__shared_ptr<MathService,_(__gnu_cxx::_Lock_policy)2> *)local_e8);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 8));
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8));
              if (*(int *)(CONCAT44(test.super___shared_ptr<MathService,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr._4_4_,
                                    test.super___shared_ptr<MathService,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr._0_4_) + 8) == 1) {
                ServiceLocator::clear(&locator);
                ServiceLocator::resolve<IMathService>((ServiceLocator *)local_e8);
                std::__shared_ptr<IMathService,_(__gnu_cxx::_Lock_policy)2>::operator=
                          (&mathService.super___shared_ptr<IMathService,_(__gnu_cxx::_Lock_policy)2>
                           ,(__shared_ptr<IMathService,_(__gnu_cxx::_Lock_policy)2> *)local_e8);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 8));
                if (mathService.super___shared_ptr<IMathService,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    == (element_type *)0x0) {
                  local_38._M_unused._M_object = (void *)0x0;
                  local_38._8_8_ = 0;
                  local_20 = std::
                             _Function_handler<std::shared_ptr<IMathService>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Seng3694[P]ServiceLocator/Test.cpp:59:40)>
                             ::_M_invoke;
                  local_28 = std::
                             _Function_handler<std::shared_ptr<IMathService>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Seng3694[P]ServiceLocator/Test.cpp:59:40)>
                             ::_M_manager;
                  ServiceLocator::registerCreator<IMathService>
                            (&locator,(function<std::shared_ptr<IMathService>_()> *)&local_38);
                  std::_Function_base::~_Function_base((_Function_base *)&local_38);
                  ServiceLocator::resolve<IMathService>((ServiceLocator *)local_e8);
                  std::__shared_ptr<IMathService,_(__gnu_cxx::_Lock_policy)2>::operator=
                            (&mathService.
                              super___shared_ptr<IMathService,_(__gnu_cxx::_Lock_policy)2>,
                             (__shared_ptr<IMathService,_(__gnu_cxx::_Lock_policy)2> *)local_e8);
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 8));
                  if (mathService.super___shared_ptr<IMathService,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr == (element_type *)0x0) {
                    __assertion = "mathService";
                    __line = 0x3e;
                  }
                  else {
                    std::static_pointer_cast<MathService,IMathService>
                              ((shared_ptr<IMathService> *)local_e8);
                    std::__shared_ptr<MathService,_(__gnu_cxx::_Lock_policy)2>::operator=
                              (&test.super___shared_ptr<MathService,_(__gnu_cxx::_Lock_policy)2>,
                               (__shared_ptr<MathService,_(__gnu_cxx::_Lock_policy)2> *)local_e8);
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 8));
                    if (*(int *)(CONCAT44(test.
                                          super___shared_ptr<MathService,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr._4_4_,
                                          test.
                                          super___shared_ptr<MathService,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr._0_4_) + 8) == 0) {
                      *(undefined4 *)
                       (CONCAT44(test.super___shared_ptr<MathService,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr._4_4_,
                                 test.super___shared_ptr<MathService,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr._0_4_) + 8) = 1;
                      ServiceLocator::resolve<IMathService>((ServiceLocator *)local_b8);
                      std::static_pointer_cast<MathService,IMathService>
                                ((shared_ptr<IMathService> *)local_e8);
                      std::__shared_ptr<MathService,_(__gnu_cxx::_Lock_policy)2>::operator=
                                (&test.super___shared_ptr<MathService,_(__gnu_cxx::_Lock_policy)2>,
                                 (__shared_ptr<MathService,_(__gnu_cxx::_Lock_policy)2> *)local_e8);
                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 8));
                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8));
                      if (*(int *)(CONCAT44(test.
                                            super___shared_ptr<MathService,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr._4_4_,
                                            test.
                                            super___shared_ptr<MathService,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr._0_4_) + 8) == 0) {
                        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                  (&test.super___shared_ptr<MathService,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount);
                        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                  (&mathService.
                                    super___shared_ptr<IMathService,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount);
                        ServiceLocator::~ServiceLocator(&locator);
                        return 0;
                      }
                      __assertion = "test->state == 0";
                      __line = 0x46;
                    }
                    else {
                      __assertion = "test->state == 0";
                      __line = 0x42;
                    }
                  }
                }
                else {
                  __assertion = "!mathService";
                  __line = 0x36;
                }
              }
              else {
                __assertion = "test->state == 1";
                __line = 0x2f;
              }
            }
            else {
              __assertion = "test->state == 0";
              __line = 0x2c;
            }
          }
        }
      }
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/Seng3694[P]ServiceLocator/Test.cpp"
                ,__line,"int main()");
}

Assistant:

int main()
{
	ServiceLocator locator;

	//Single instance creation => everytime "resolve" gets called the same instance will be returned
	locator.registerInstance<IMathService>(new MathService());

	auto mathService = locator.resolve<IMathService>();
	assert(mathService);
	assert(mathService->add(10, 20) == 30);
	assert(mathService->subtract(30, 10) == 20);
	assert(mathService->multiply(2, 2.5) == 5);
	assert(mathService->divide(30, 10) == 3);

	//simple check if it's really the same instance
	auto test = std::static_pointer_cast<MathService>(mathService);
	assert(test->state == 0);
	test->state = 1;
	test = std::static_pointer_cast<MathService>(locator.resolve<IMathService>());
	assert(test->state == 1);


	//explicit clear of all instances
	locator.clear();
	//there should be no IMathService anymore
	mathService = locator.resolve<IMathService>();
	assert(!mathService);


	//you can create lazy instances with a delegate which returns a shared ptr
	//the instance will be created everytime the "resolve" method gets called
	locator.registerCreator<IMathService>([]() { return std::make_shared<MathService>(); });
	
	mathService = locator.resolve<IMathService>();
	assert(mathService);

	//same check as above but this time changing the state and resolving the service should return an other instance
	test = std::static_pointer_cast<MathService>(mathService);
	assert(test->state == 0);
	test->state = 1;

	test = std::static_pointer_cast<MathService>(locator.resolve<IMathService>());
	assert(test->state == 0);

	return 0;
}